

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O2

ChFrame<double> * __thiscall
chrono::ChFrame<double>::operator=(ChFrame<double> *this,ChFrame<double> *other)

{
  if (other != this) {
    ChCoordsys<double>::operator=(&this->coord,&other->coord);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
              (&(this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>,
               &(other->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>);
  }
  return this;
}

Assistant:

ChFrame<Real>& operator=(const ChFrame<Real>& other) {
        if (&other == this)
            return *this;
        coord = other.coord;
        Amatrix = other.Amatrix;
        return *this;
    }